

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationZZ.hpp
# Opt level: O0

int __thiscall
qclab::qgates::RotationZZ<std::complex<double>_>::toQASM
          (RotationZZ<std::complex<double>_> *this,ostream *stream,int offset)

{
  int qubit0;
  int qubit1;
  reference pvVar1;
  real_type angle;
  __string_type local_58;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  ostream *stream_local;
  RotationZZ<std::complex<double>_> *this_local;
  
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = offset;
  (*(this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])();
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_38,0);
  qubit0 = *pvVar1 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_38,1);
  qubit1 = *pvVar1 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
  angle = QRotationGate2<std::complex<double>_>::theta
                    (&this->super_QRotationGate2<std::complex<double>_>);
  qasmRzz<double>(&local_58,qubit0,qubit1,angle);
  std::operator<<(stream,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          auto qubits = this->qubits() ;
          stream << qasmRzz( qubits[0] + offset ,
                             qubits[1] + offset , this->theta() ) ;
          return 0 ;
        }